

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseExternref(WastParser *this,Const *const_)

{
  anon_union_16_2_ecfd7102_for_Location_1 *paVar1;
  TokenType TVar2;
  Result RVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  uint64_t ref_bits;
  Token token;
  Token local_d8;
  size_t local_98;
  char *pcStack_90;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_88;
  undefined8 uStack_80;
  Token local_70;
  
  Consume(&local_70,this);
  if ((this->options_->features).reference_types_enabled_ == false) {
    Error(this,0x1a8e2e);
  }
  else {
    GetToken(&local_d8,this);
    local_88.offset = (size_t)local_d8.loc.field_1.field_1.offset;
    uStack_80 = local_d8.loc.field_1._8_8_;
    local_98 = local_d8.loc.filename._M_len;
    pcStack_90 = local_d8.loc.filename._M_str;
    (const_->loc).field_1.field_1.offset = (size_t)local_d8.loc.field_1.field_1.offset;
    *(undefined8 *)((long)&(const_->loc).field_1 + 8) = local_d8.loc.field_1._8_8_;
    (const_->loc).filename._M_len = local_d8.loc.filename._M_len;
    (const_->loc).filename._M_str = local_d8.loc.filename._M_str;
    TVar2 = Peek(this,0);
    if ((TVar2 & ~After) != Int) {
      paVar1 = &local_d8.loc.field_1;
      local_d8.loc.filename._M_len = (size_t)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"a numeric literal","");
      local_98 = 0;
      pcStack_90 = (char *)0x0;
      local_88.offset = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
                 &local_d8,&local_d8.token_type_);
      RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_98,"123");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_98);
      if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_d8.loc.filename._M_len == paVar1) {
        return (Result)RVar3.enum_;
      }
      operator_delete((void *)local_d8.loc.filename._M_len,
                      (long)local_d8.loc.field_1.field_1.offset + 1);
      return (Result)RVar3.enum_;
    }
    Consume(&local_d8,this);
    if (2 < local_d8.token_type_ - First_Literal) {
      __assert_fail("HasLiteral()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/token.h"
                    ,0x72,"const Literal &wabt::Token::literal() const");
    }
    RVar3 = ParseInt64(local_d8.field_2.literal_.text._M_str,
                       local_d8.field_2.literal_.text._M_str + (long)local_d8.field_2.text_._M_str,
                       (uint64_t *)&local_d8,UnsignedOnly);
    (const_->type_).enum_ = ExternRef;
    (const_->type_).type_index_ = 0;
    *(size_t *)(const_->data_).v = local_d8.loc.filename._M_len;
    const_->nan_[0] = None;
    if (RVar3.enum_ != Error) {
      return (Result)Ok;
    }
    Error(this,const_->loc,"invalid literal \"%.*s\"",
          local_d8.field_2.literal_.text._M_len & 0xffffffff,local_d8.field_2.literal_.text._M_str,
          in_R8,in_R9);
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseExternref(Const* const_) {
  WABT_TRACE(ParseExternref);
  Token token = Consume();
  if (!options_->features.reference_types_enabled()) {
    Error(token.loc, "externref not allowed");
    return Result::Error;
  }

  Literal literal;
  std::string_view sv;
  const_->loc = GetLocation();
  TokenType token_type = Peek();

  switch (token_type) {
    case TokenType::Nat:
    case TokenType::Int: {
      literal = Consume().literal();
      sv = literal.text;
      break;
    }
    default:
      return ErrorExpected({"a numeric literal"}, "123");
  }

  uint64_t ref_bits;
  Result result = ParseInt64(sv, &ref_bits, ParseIntType::UnsignedOnly);

  const_->set_externref(static_cast<uintptr_t>(ref_bits));

  if (Failed(result)) {
    Error(const_->loc, "invalid literal \"" PRIstringview "\"",
          WABT_PRINTF_STRING_VIEW_ARG(literal.text));
    // Return if parser get errors.
    return Result::Error;
  }

  return Result::Ok;
}